

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.cpp
# Opt level: O1

double despot::Gamma::Next(double k,double theta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  bool bVar6;
  ulong uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  double dVar10;
  double local_58;
  double local_48;
  double local_38;
  undefined1 local_28 [16];
  
  if (1.0 <= k) {
    dVar10 = k + k + -1.0;
    local_48 = SQRT(dVar10);
    dVar1 = local_48;
    if (dVar10 < 0.0) {
      dVar1 = sqrt(dVar10);
      local_48 = sqrt(dVar10);
    }
    do {
      dVar10 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar2 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar5 = log(dVar2 / (1.0 - dVar2));
      dVar3 = exp(dVar5 / local_48);
      uVar9 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
      dVar2 = dVar10 * dVar2 * dVar2;
      dVar10 = ((dVar5 / local_48) * (dVar1 + k) + k + -1.3862943611198906) - dVar3 * k;
      if (dVar2 * 4.5 + -2.504077396776274 <= dVar10) {
LAB_0016e08f:
        bVar6 = false;
        local_28._8_8_ = uVar9;
        local_28._0_8_ = dVar3 * k * theta;
      }
      else {
        dVar2 = log(dVar2);
        uVar9 = 0;
        bVar6 = true;
        if (dVar2 <= dVar10) goto LAB_0016e08f;
      }
    } while (bVar6);
  }
  else {
    dVar1 = pow(k,k / (1.0 - k));
    do {
      dVar10 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar2 = Random::NextDouble((Random *)&Random::RANDOM);
      dVar10 = log(dVar10);
      local_38 = -dVar10;
      local_58 = log(dVar2);
      local_58 = -local_58;
      dVar2 = pow(local_38,1.0 / k);
      dVar5 = dVar1 * (1.0 - k) + dVar2;
      uVar7 = -(ulong)(local_58 - dVar10 < dVar5);
      auVar8._0_8_ = local_28._0_8_ & uVar7;
      auVar8._8_8_ = 0;
      auVar4._8_4_ = extraout_XMM0_Dc;
      auVar4._0_8_ = ~uVar7 & (ulong)(dVar2 * theta);
      auVar4._12_4_ = extraout_XMM0_Dd;
      local_28 = auVar8 | auVar4;
    } while (local_58 - dVar10 < dVar5);
  }
  return (double)local_28._0_8_;
}

Assistant:

double Gamma::Next(double k, double theta) {
	if (k < 1) {
		double c = 1 / k;
		double d = (1 - k) * pow(k, k / (1 - k));
		double z, e, x;
		while (true) { //Weibull's algorithm
			double u = Random::RANDOM.NextDouble();
			double v = Random::RANDOM.NextDouble();
			z = -log(u);
			e = -log(v);
			x = pow(z, c);
			if (z + e >= d + x)
				return x * theta;
		}
	} else { // Cheng's algorithm
		double b = k - log(4);
		double c = k + sqrt(2 * k - 1);
		double d = sqrt(2 * k - 1);
		double e = 1 + log(4.5);
		double x, y, z, r;
		while (true) {
			double u = Random::RANDOM.NextDouble();
			double v = Random::RANDOM.NextDouble();
			y = log(v / (1 - v)) / d;
			x = k * exp(y);
			z = u * v * v;
			r = b + c * y - x;
			if (r >= 4.5 * z - e || r >= log(z))
				return x * theta;
		}
	}
}